

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O0

int i2a_ASN1_OBJECT(BIO *bp,ASN1_OBJECT *a)

{
  int local_8c;
  int ret;
  int len;
  char *str;
  char *allocated;
  char buf [80];
  ASN1_OBJECT *a_local;
  BIO *bp_local;
  
  if ((a == (ASN1_OBJECT *)0x0) || (a->data == (uchar *)0x0)) {
    bp_local._4_4_ = write_str((BIO *)bp,"NULL");
  }
  else {
    str = (char *)0x0;
    _ret = (char *)&allocated;
    local_8c = i2t_ASN1_OBJECT((char *)&allocated,0x50,a);
    if (0x4f < local_8c) {
      _ret = (char *)OPENSSL_malloc((long)(local_8c + 1));
      if ((char **)_ret == (char **)0x0) {
        return -1;
      }
      local_8c = i2t_ASN1_OBJECT(_ret,local_8c + 1,a);
      str = _ret;
    }
    if (local_8c < 1) {
      _ret = "<INVALID>";
    }
    bp_local._4_4_ = write_str((BIO *)bp,_ret);
    OPENSSL_free(str);
  }
  return bp_local._4_4_;
}

Assistant:

int i2a_ASN1_OBJECT(BIO *bp, const ASN1_OBJECT *a) {
  if (a == NULL || a->data == NULL) {
    return write_str(bp, "NULL");
  }

  char buf[80], *allocated = NULL;
  const char *str = buf;
  int len = i2t_ASN1_OBJECT(buf, sizeof(buf), a);
  if (len > (int)sizeof(buf) - 1) {
    // The input was truncated. Allocate a buffer that fits.
    allocated = reinterpret_cast<char *>(OPENSSL_malloc(len + 1));
    if (allocated == NULL) {
      return -1;
    }
    len = i2t_ASN1_OBJECT(allocated, len + 1, a);
    str = allocated;
  }
  if (len <= 0) {
    str = "<INVALID>";
  }

  int ret = write_str(bp, str);
  OPENSSL_free(allocated);
  return ret;
}